

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O0

int EVP_tls_cbc_remove_padding
              (crypto_word_t *out_padding_ok,size_t *out_len,uint8_t *in,size_t in_len,
              size_t block_size,size_t mac_size)

{
  byte bVar1;
  byte bVar2;
  ulong a;
  crypto_word_t cVar3;
  uint8_t b;
  ulong uStack_68;
  uint8_t mask;
  size_t i;
  size_t to_check;
  crypto_word_t good;
  size_t padding_length;
  size_t overhead;
  size_t mac_size_local;
  size_t block_size_local;
  size_t in_len_local;
  uint8_t *in_local;
  size_t *out_len_local;
  crypto_word_t *out_padding_ok_local;
  
  if (in_len < mac_size + 1) {
    out_padding_ok_local._4_4_ = 0;
  }
  else {
    bVar1 = in[in_len - 1];
    a = (ulong)bVar1;
    to_check = constant_time_ge_w(in_len,mac_size + 1 + a);
    i = 0x100;
    if (in_len < 0x100) {
      i = in_len;
    }
    for (uStack_68 = 0; uStack_68 < i; uStack_68 = uStack_68 + 1) {
      bVar2 = constant_time_ge_8(a,uStack_68);
      to_check = ((ulong)(bVar2 & (bVar1 ^ in[(in_len - 1) - uStack_68])) ^ 0xffffffffffffffff) &
                 to_check;
    }
    cVar3 = constant_time_eq_w(0xff,to_check & 0xff);
    *out_len = in_len - (cVar3 & a + 1);
    *out_padding_ok = cVar3;
    out_padding_ok_local._4_4_ = 1;
  }
  return out_padding_ok_local._4_4_;
}

Assistant:

int EVP_tls_cbc_remove_padding(crypto_word_t *out_padding_ok, size_t *out_len,
                               const uint8_t *in, size_t in_len,
                               size_t block_size, size_t mac_size) {
  const size_t overhead = 1 /* padding length byte */ + mac_size;

  // These lengths are all public so we can test them in non-constant time.
  if (overhead > in_len) {
    return 0;
  }

  size_t padding_length = in[in_len - 1];

  crypto_word_t good = constant_time_ge_w(in_len, overhead + padding_length);
  // The padding consists of a length byte at the end of the record and
  // then that many bytes of padding, all with the same value as the
  // length byte. Thus, with the length byte included, there are i+1
  // bytes of padding.
  //
  // We can't check just |padding_length+1| bytes because that leaks
  // decrypted information. Therefore we always have to check the maximum
  // amount of padding possible. (Again, the length of the record is
  // public information so we can use it.)
  size_t to_check = 256;  // maximum amount of padding, inc length byte.
  if (to_check > in_len) {
    to_check = in_len;
  }

  for (size_t i = 0; i < to_check; i++) {
    uint8_t mask = constant_time_ge_8(padding_length, i);
    uint8_t b = in[in_len - 1 - i];
    // The final |padding_length+1| bytes should all have the value
    // |padding_length|. Therefore the XOR should be zero.
    good &= ~(mask & (padding_length ^ b));
  }

  // If any of the final |padding_length+1| bytes had the wrong value,
  // one or more of the lower eight bits of |good| will be cleared.
  good = constant_time_eq_w(0xff, good & 0xff);

  // Always treat |padding_length| as zero on error. If, assuming block size of
  // 16, a padding of [<15 arbitrary bytes> 15] treated |padding_length| as 16
  // and returned -1, distinguishing good MAC and bad padding from bad MAC and
  // bad padding would give POODLE's padding oracle.
  padding_length = good & (padding_length + 1);
  *out_len = in_len - padding_length;
  *out_padding_ok = good;
  return 1;
}